

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O1

S2Cap * __thiscall
S2MinDistancePointTarget::GetCapBound(S2Cap *__return_storage_ptr__,S2MinDistancePointTarget *this)

{
  VType VVar1;
  bool bVar2;
  S2LogMessage local_20;
  
  S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,0.0);
  (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002c1748;
  VVar1 = (this->point_).c_[1];
  (__return_storage_ptr__->center_).c_[0] = (this->point_).c_[0];
  (__return_storage_ptr__->center_).c_[1] = VVar1;
  (__return_storage_ptr__->center_).c_[2] = (this->point_).c_[2];
  bVar2 = S2::IsUnitLength(&__return_storage_ptr__->center_);
  if ((bVar2) && ((__return_storage_ptr__->radius_).length2_ <= 4.0)) {
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
             ,0xf5,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_20.stream_,"Check failed: is_valid() ",0x19);
  abort();
}

Assistant:

S2Cap S2MinDistancePointTarget::GetCapBound() {
  return S2Cap(point_, S1ChordAngle::Zero());
}